

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::ElementArrayBufferBindingTestCase::test
          (ElementArrayBufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  GLuint bufferObject;
  GLuint buffers [2];
  ScopedLogSection section;
  string local_f8;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  string local_b8;
  undefined8 local_98;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  GLuint local_50 [2];
  ScopedLogSection local_48;
  code *local_40;
  GLenum local_38;
  
  pTVar2 = gl->m_log;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"DefaultVAO","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Test with default VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_48,pTVar2,&local_b8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  local_98 = (ulong)local_98._4_4_ << 0x20;
  glu::CallLogWrapper::glGenBuffers(gl,1,(GLuint *)&local_98);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_0121b1ff;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_0121b1ff:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    local_d8 = &local_c8;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar4[3];
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar4;
    }
    local_d0 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8.field_2._8_8_ = plVar5[3];
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,(GLuint)local_98);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,(GLuint)local_98,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteBuffers(gl,1,(GLuint *)&local_98);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  tcu::TestLog::endSection(local_48.m_log);
  pTVar2 = gl->m_log;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"WithVAO","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Test with VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_48,pTVar2,&local_b8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = 0;
  local_50[0] = 0;
  local_50[1] = 0;
  glu::CallLogWrapper::glGenVertexArrays(gl,2,(GLuint *)&local_98);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_0121b545;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_0121b545:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    local_d8 = &local_c8;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar4[3];
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar4;
    }
    local_d0 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8.field_2._8_8_ = plVar5[3];
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  glu::CallLogWrapper::glGenBuffers(gl,2,local_50);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
    uVar7 = 0xf;
    if (local_70 != local_60) {
      uVar7 = local_60[0];
    }
    if (uVar7 < local_90._M_string_length + local_68) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar8 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_0121b79c;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_0121b79c:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    local_d8 = &local_c8;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar4[3];
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar4;
    }
    local_d0 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8.field_2._8_8_ = plVar5[3];
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexArray(gl,(GLuint)local_98);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,local_50[0]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,local_50[0],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindVertexArray(gl,local_98._4_4_);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,local_50[1]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,local_50[1],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindVertexArray(gl,(GLuint)local_98);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,local_50[0],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteBuffers(gl,2,local_50);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindVertexArray(gl,local_98._4_4_);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,local_50[1],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteVertexArrays(gl,2,(GLuint *)&local_98);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 == 0) goto LAB_0121bca5;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
  local_40 = glu::getErrorName;
  local_38 = GVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_40);
  uVar7 = 0xf;
  if (local_70 != local_60) {
    uVar7 = local_60[0];
  }
  if (uVar7 < local_90._M_string_length + local_68) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_68) goto LAB_0121bb0a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0121bb0a:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  }
  local_d8 = &local_c8;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_c8 = *plVar5;
    uStack_c0 = puVar4[3];
  }
  else {
    local_c8 = *plVar5;
    local_d8 = (long *)*puVar4;
  }
  local_d0 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b8.field_2._M_allocated_capacity = *psVar6;
    local_b8.field_2._8_8_ = plVar5[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar6;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
LAB_0121bca5:
  tcu::TestLog::endSection(local_48.m_log);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(gl.getLog(), "DefaultVAO", "Test with default VAO");

			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			GLuint bufferObject = 0;
			gl.glGenBuffers(1, &bufferObject);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, bufferObject);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, bufferObject, m_type);

			gl.glDeleteBuffers(1, &bufferObject);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(gl.getLog(), "WithVAO", "Test with VAO");

			GLuint vaos[2]		= {0};
			GLuint buffers[2]	= {0};

			gl.glGenVertexArrays(2, vaos);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenVertexArrays");

			gl.glGenBuffers(2, buffers);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

			// initial
			gl.glBindVertexArray(vaos[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// after setting
			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffers[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[0], m_type);

			// initial of vao 2
			gl.glBindVertexArray(vaos[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// after setting to 2
			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffers[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[1], m_type);

			// vao 1 still has buffer 1 bound?
			gl.glBindVertexArray(vaos[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[0], m_type);

			// deleting clears from bound vaos ...
			gl.glDeleteBuffers(2, buffers);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// ... but does not from non-bound vaos?
			gl.glBindVertexArray(vaos[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[1], m_type);

			gl.glDeleteVertexArrays(2, vaos);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteVertexArrays");
		}
	}